

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

_Bool run_PPU_cycle(void)

{
  uint16_t scanline;
  uint16_t dot;
  uint16_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  _Bool _Var6;
  uint16_t uVar7;
  uint8_t *puVar8;
  ushort uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ushort local_58;
  ushort local_40;
  
  uVar1 = ::scanline;
  bVar10 = ::scanline < 0xf0;
  bVar12 = ::scanline == 0x105;
  bVar11 = (ushort)(::dot - 1) < 0x100;
  local_58 = ::dot - 0x102;
  uVar9 = ::dot & 7;
  local_40 = ::dot - 0x141;
  bVar2 = debug_read_RAM(0x2000);
  bVar3 = debug_read_RAM(0x2001);
  dot = ::dot;
  scanline = ::scanline;
  if ((bVar3 & 0x18) == 0) goto LAB_0010bdce;
  uVar7 = get_VRAM_address();
  if ((uVar1 < 0xf0) && (bVar11)) {
    render_pixel((BG_shift_registers *)execute_ppu_background_regs,scanline,dot);
  }
  if (bVar10 || bVar12) {
    if (0xff06 < local_58 && uVar9 == 1) {
      execute_ppu_background_regs._2_2_ =
           execute_ppu_background_regs._2_2_ | (ushort)execute_ppu_fetched_bytes_1;
      execute_ppu_background_regs._0_2_ =
           execute_ppu_background_regs._0_2_ | (ushort)execute_ppu_fetched_bytes_0;
      bVar4 = execute_ppu_fetched_bytes_3 >> ((char)uVar7 - 1U & 2 | (byte)(uVar7 >> 4) & 4);
      execute_ppu_background_regs[8] = bVar4 & 1;
      execute_ppu_background_regs[9] = bVar4 >> 1 & 1;
    }
    if (bVar11) {
      switch(dot & 7) {
      case 1:
        uVar9 = uVar7 & 0xfff | 0x2000;
        puVar8 = &execute_ppu_fetched_bytes_2;
        break;
      default:
        goto switchD_0010bb86_caseD_2;
      case 3:
        uVar9 = (uVar7 >> 2 & 7) + (uVar7 >> 4 & 0x38 | uVar7 & 0xc00) + 0x23c0;
        puVar8 = &execute_ppu_fetched_bytes_3;
        break;
      case 5:
        uVar9 = (ushort)execute_ppu_fetched_bytes_2 << 4 | uVar7 >> 0xc & 0xff7 |
                (ushort)(bVar2 & 0x10) << 8;
        puVar8 = &execute_ppu_fetched_bytes_1;
        break;
      case 7:
        uVar9 = (ushort)execute_ppu_fetched_bytes_2 << 4 | uVar7 >> 0xc |
                (ushort)(bVar2 & 0x10) << 8 | 8;
        puVar8 = &execute_ppu_fetched_bytes_0;
      }
      uVar5 = read_VRAM(uVar9);
      *puVar8 = uVar5;
    }
  }
switchD_0010bb86_caseD_2:
  if ((ushort)(dot - 2) < 0x100 || (ushort)(dot - 0x142) < 0x10) {
    execute_ppu_background_regs._2_2_ = execute_ppu_background_regs._2_2_ << 1;
    execute_ppu_background_regs._0_2_ = execute_ppu_background_regs._0_2_ << 1;
    execute_ppu_background_regs._6_2_ =
         (ushort)execute_ppu_background_regs[8] + execute_ppu_background_regs._6_2_ * 2;
    execute_ppu_background_regs._4_2_ =
         (ushort)execute_ppu_background_regs[9] + execute_ppu_background_regs._4_2_ * 2;
  }
  if (!bVar10 && !bVar12) goto LAB_0010bdce;
  if ((ushort)(::dot - 1) < 0x40) {
    secondary_OAM_clear(dot);
  }
  if ((uVar1 < 0xf0) && ((ushort)(::dot - 0x41) < 0xc0)) {
    sprite_evaluation(scanline,dot,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (0x13f < dot) {
    set_OAM_address('\0');
  }
  if ((ushort)(::dot - 0x101) < 0x40) {
    do_sprite_load(scanline,dot,0,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (dot == 0x100) {
    incrementY();
  }
  if (bVar11) {
    if ((dot & 7) == 0) {
LAB_0010bd58:
      incrementX();
    }
  }
  else if (local_40 < 0x10 && (dot & 7) == 0) goto LAB_0010bd58;
  if (dot == 0x101) {
    copyX();
  }
  if ((ushort)(dot - 0x118) < 0x19 && uVar1 == 0x105) {
    copyY();
  }
  if (dot == 0x42 && uVar1 == 0x105) {
    clear_sprite0();
  }
  if (dot == 1 && uVar1 == 0x105) {
    clear_sprite_zero_hit();
    clear_sprite_overflow();
  }
LAB_0010bdce:
  if (((((bVar3 & 8) == 0) || (odd_frame != true)) || (!bVar12)) || (::dot != 0x153)) {
    uVar1 = ::dot + 1;
    if (0x154 < (ushort)(::dot + 1)) {
      uVar1 = ::dot - 0x154;
      if (bVar12) {
        ::scanline = 0;
        odd_frame = (_Bool)(odd_frame ^ 1);
      }
      else {
        ::scanline = ::scanline + 1;
      }
    }
  }
  else {
    ::scanline = 0;
    ::dot = 0;
    odd_frame = false;
    uVar1 = ::dot;
  }
  ::dot = uVar1;
  if (::dot == 1 && ::scanline == 0xf1) {
    set_vblank_bit();
    check_VBlank_vblank = 1;
    _Var6 = is_NMI_set_in_RAM();
    if (_Var6) {
      NMI_flag = 1;
    }
  }
  else if (::scanline == 0x105 && ::dot == 1) {
    clear_vblank_bit();
    check_VBlank_vblank = 0;
  }
  return (_Bool)check_VBlank_vblank;
}

Assistant:

bool run_PPU_cycle() {
    line_status status = get_ppu_line_status(scanline, dot);
    ppu_regs ppu_regs = get_ppu_registers();

    if(is_rendering_enabled(ppu_regs))
        execute_ppu(&ppu_regs, &status, scanline, dot);

    tick(ppu_regs, status, &scanline, &dot);
    return check_VBlank(ppu_regs, scanline, dot, &NMI_flag);
}